

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,u32 iLabel)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  u32 uVar4;
  uint uVar5;
  u32 uVar6;
  u32 uVar7;
  void *pvVar8;
  u8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  u32 v;
  int iVar14;
  byte bVar15;
  long in_FS_OFFSET;
  bool bVar16;
  JsonParse v_1;
  char *local_f8;
  uint local_ec;
  size_t local_e8;
  JsonParse local_d8;
  undefined1 local_88 [16];
  char *local_78;
  sqlite3 *psStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  u8 *local_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  cVar2 = *zPath;
  uVar4 = 0xfffffffd;
  if (cVar2 == '[') {
    if ((pParse->aBlob[iRoot] & 0xf) == 0xb) {
      uVar7 = jsonbPayloadSize(pParse,iRoot,&local_3c);
      uVar4 = 0xfffffffd;
      bVar15 = zPath[1];
      if ((ulong)bVar15 - 0x3a < 0xfffffffffffffff6) {
LAB_001b8eb3:
        if (bVar15 != 0x23) goto LAB_001b92df;
        uVar6 = jsonbArrayCount(pParse,iRoot);
        bVar15 = zPath[2];
        if (bVar15 == 0x2d) {
          uVar10 = (ulong)(byte)zPath[3];
          uVar4 = 0xfffffffd;
          if (uVar10 - 0x3a < 0xfffffffffffffff6) goto LAB_001b92df;
          uVar5 = 0;
          uVar11 = 3;
          do {
            uVar5 = ((int)(char)uVar10 + uVar5 * 10) - 0x30;
            uVar12 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar12;
            bVar15 = zPath[uVar11];
            uVar10 = (ulong)bVar15;
          } while (0xfffffffffffffff5 < uVar10 - 0x3a);
          bVar16 = uVar6 < uVar5;
          uVar6 = uVar6 - uVar5;
          if (bVar16) goto LAB_001b92da;
        }
        else {
          uVar12 = 2;
        }
        uVar4 = 0xfffffffd;
        if (bVar15 != 0x5d) goto LAB_001b92df;
      }
      else {
        uVar11 = 1;
        uVar6 = 0;
        uVar10 = (ulong)bVar15;
        do {
          uVar6 = ((int)(char)uVar10 + uVar6 * 10) - 0x30;
          uVar12 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar12;
          uVar10 = (ulong)(byte)zPath[uVar11];
        } while (0xfffffffffffffff5 < uVar10 - 0x3a);
        if (uVar12 < 2 || zPath[uVar11] != 0x5d) goto LAB_001b8eb3;
      }
      uVar5 = uVar7 + iRoot;
      uVar13 = local_3c + uVar5;
      for (; uVar5 < uVar13; uVar5 = uVar4 + uVar5 + local_3c) {
        bVar16 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar16) {
          uVar4 = jsonLookupStep(pParse,uVar5,zPath + (uVar12 + 1),0);
          if (pParse->delta != 0) {
            jsonAfterEditSizeAdjust(pParse,iRoot);
          }
          goto LAB_001b92df;
        }
        uVar4 = jsonbPayloadSize(pParse,uVar5,&local_3c);
        if (uVar4 == 0) goto LAB_001b9445;
      }
      uVar4 = 0xffffffff;
      if (uVar13 < uVar5) goto LAB_001b92df;
      if (uVar6 == 0) {
        uVar4 = 0xfffffffe;
        if (2 < pParse->eEdit) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          psStack_70 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          uVar4 = jsonCreateEditSubstructure(pParse,(JsonParse *)local_88,zPath + (uVar12 + 1));
          if (uVar4 < 0xfffffffd) {
            iVar3 = jsonBlobMakeEditable(pParse,local_88._8_4_);
            if (iVar3 != 0) {
              jsonBlobEdit(pParse,uVar5,0,(u8 *)local_88._0_8_,local_88._8_4_);
            }
          }
          jsonParseReset((JsonParse *)local_88);
          if (pParse->delta != 0) {
LAB_001b943b:
            jsonAfterEditSizeAdjust(pParse,iRoot);
          }
        }
        goto LAB_001b92df;
      }
    }
LAB_001b92da:
    uVar4 = 0xfffffffe;
    goto LAB_001b92df;
  }
  if (cVar2 != '.') {
    if (cVar2 == '\0') {
      if ((pParse->eEdit != '\0') && (iVar3 = jsonBlobMakeEditable(pParse,pParse->nIns), iVar3 != 0)
         ) {
        uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
        if (pParse->eEdit != '\x03') {
          uVar4 = uVar4 + local_3c;
          if (pParse->eEdit == '\x01') {
            iVar3 = iRoot - iLabel;
            uVar6 = iLabel;
            if (iLabel == 0) {
              iVar3 = 0;
              uVar6 = iRoot;
            }
            uVar4 = uVar4 + iVar3;
            puVar9 = (u8 *)0x0;
            uVar7 = 0;
            iRoot = uVar6;
          }
          else {
            puVar9 = pParse->aIns;
            uVar7 = pParse->nIns;
          }
          jsonBlobEdit(pParse,iRoot,uVar4,puVar9,uVar7);
        }
      }
      pParse->iLabel = iLabel;
      uVar4 = iRoot;
    }
    goto LAB_001b92df;
  }
  puVar9 = pParse->aBlob;
  bVar15 = puVar9[iRoot];
  pcVar1 = zPath + 1;
  cVar2 = zPath[1];
  if (cVar2 == '\"') {
    uVar10 = 1;
    do {
      uVar12 = (uint)uVar10;
      cVar2 = pcVar1[uVar10];
      if (cVar2 == '\\') {
        if (pcVar1[uVar12 + 1] != '\0') {
          uVar12 = uVar12 + 1;
        }
      }
      else {
        if (cVar2 == '\0') goto LAB_001b92df;
        if (cVar2 == '\"') goto LAB_001b8f5d;
      }
      uVar10 = (ulong)(uVar12 + 1);
    } while( true );
  }
  uVar10 = 0;
  while (((cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '['))) {
    uVar10 = (ulong)((int)uVar10 + 1);
    cVar2 = pcVar1[uVar10];
  }
  local_ec = 1;
  local_f8 = pcVar1;
  local_e8 = uVar10;
  if ((int)uVar10 == 0) goto LAB_001b92df;
  goto LAB_001b8f8e;
LAB_001b9445:
  uVar4 = 0xffffffff;
  goto LAB_001b92df;
LAB_001b8f5d:
  uVar10 = (ulong)(uVar12 + 1);
  pvVar8 = memchr(zPath + 2,0x5c,(ulong)(uVar12 - 1));
  local_ec = (uint)(pvVar8 == (void *)0x0);
  local_f8 = zPath + 2;
  local_e8 = (ulong)(uVar12 - 1);
LAB_001b8f8e:
  uVar4 = 0xfffffffe;
  if ((bVar15 & 0xf) == 0xc) {
    uVar4 = jsonbPayloadSize(pParse,iRoot,&local_3c);
    uVar12 = uVar4 + iRoot;
    uVar5 = local_3c + uVar12;
    uVar7 = (u32)local_e8;
    while (uVar12 < uVar5) {
      bVar15 = puVar9[uVar12] & 0xf;
      uVar4 = 0xffffffff;
      if ((byte)(bVar15 - 0xb) < 0xfc) goto LAB_001b92df;
      uVar4 = jsonbPayloadSize(pParse,uVar12,&local_3c);
      if (uVar4 == 0) goto LAB_001b9445;
      uVar13 = local_3c + uVar4 + uVar12;
      if (uVar5 <= uVar13) goto LAB_001b9445;
      iVar3 = jsonLabelCompare(local_f8,uVar7,local_ec,(char *)(puVar9 + (uVar4 + uVar12)),local_3c,
                               (uint)(bVar15 == 10 || bVar15 == 7));
      puVar9 = pParse->aBlob;
      if (iVar3 != 0) {
        if ((0xc < (puVar9[uVar13] & 0xf)) ||
           (uVar7 = jsonbPayloadSize(pParse,uVar13,&local_3c), uVar7 == 0)) goto LAB_001b9445;
        uVar4 = 0xffffffff;
        if ((uVar5 < uVar7 + uVar13 + local_3c) ||
           (uVar4 = jsonLookupStep(pParse,uVar13,pcVar1 + uVar10,uVar12), pParse->delta == 0))
        goto LAB_001b92df;
        goto LAB_001b943b;
      }
      if (0xc < (puVar9[uVar13] & 0xf)) goto LAB_001b9445;
      uVar6 = jsonbPayloadSize(pParse,uVar13,&local_3c);
      uVar4 = 0xffffffff;
      if (uVar6 == 0) goto LAB_001b92df;
      uVar12 = uVar6 + uVar13 + local_3c;
    }
    uVar4 = 0xffffffff;
    if ((uVar12 <= uVar5) && (uVar4 = 0xfffffffe, 2 < pParse->eEdit)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      psStack_70 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8.bJsonIsRCStr = '\0';
      local_d8.hasNonstd = '\0';
      local_d8.bReadOnly = '\0';
      local_d8.eEdit = '\0';
      local_d8.delta = 0;
      local_d8.nIns = 0;
      local_d8.iLabel = 0;
      local_d8.nJson = 0;
      local_d8.nJPRef = 0;
      local_d8.iErr = 0;
      local_d8.iDepth = 0;
      local_d8.nErr = '\0';
      local_d8.oom = '\0';
      local_d8.zJson = (char *)0x0;
      local_d8.aBlob = (u8 *)0x0;
      local_d8.nBlob = 0;
      local_d8.nBlobAlloc = 0;
      local_d8.aIns = (u8 *)0x0;
      local_d8.db = pParse->db;
      jsonBlobAppendNode(&local_d8,'\n' - (local_ec == 0),uVar7,(void *)0x0);
      pParse->oom = pParse->oom | local_d8.oom;
      uVar4 = jsonCreateEditSubstructure(pParse,(JsonParse *)local_88,pcVar1 + uVar10);
      if (uVar4 < 0xfffffffd) {
        uVar6 = local_d8.nBlob;
        uVar10 = local_d8._8_8_ & 0xffffffff;
        iVar14 = local_d8.nBlob + uVar7;
        iVar3 = jsonBlobMakeEditable(pParse,local_88._8_4_ + iVar14);
        if (iVar3 != 0) {
          jsonBlobEdit(pParse,uVar12,0,(u8 *)0x0,iVar14 + local_88._8_4_);
          if (pParse->oom == '\0') {
            memcpy(pParse->aBlob + uVar12,local_d8.aBlob,uVar10);
            memcpy(pParse->aBlob + (uVar12 + uVar6),local_f8,local_e8);
            memcpy(pParse->aBlob + (uVar12 + uVar6 + uVar7),(void *)local_88._0_8_,
                   local_88._8_8_ & 0xffffffff);
            if (pParse->delta != 0) {
              jsonAfterEditSizeAdjust(pParse,iRoot);
            }
          }
        }
      }
      jsonParseReset((JsonParse *)local_88);
      jsonParseReset(&local_d8);
    }
  }
LAB_001b92df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static u32 jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this element of aBlob[] */
  const char *zPath,      /* The path to search */
  u32 iLabel              /* Label if iRoot is a value of in an object */
){
  u32 i, j, k, nKey, sz, n, iEnd, rc;
  const char *zKey;
  u8 x;

  if( zPath[0]==0 ){
    if( pParse->eEdit && jsonBlobMakeEditable(pParse, pParse->nIns) ){
      n = jsonbPayloadSize(pParse, iRoot, &sz);
      sz += n;
      if( pParse->eEdit==JEDIT_DEL ){
        if( iLabel>0 ){
          sz += iRoot - iLabel;
          iRoot = iLabel;
        }
        jsonBlobEdit(pParse, iRoot, sz, 0, 0);
      }else if( pParse->eEdit==JEDIT_INS ){
        /* Already exists, so json_insert() is a no-op */
      }else{
        /* json_set() or json_replace() */
        jsonBlobEdit(pParse, iRoot, sz, pParse->aIns, pParse->nIns);
      }
    }
    pParse->iLabel = iLabel;
    return iRoot;
  }
  if( zPath[0]=='.' ){
    int rawKey = 1;
    x = pParse->aBlob[iRoot];
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){
        if( zPath[i]=='\\' && zPath[i+1]!=0 ) i++;
      }
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
      testcase( nKey==0 );
      rawKey = memchr(zKey, '\\', nKey)==0;
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        return JSON_LOOKUP_PATHERROR;
      }
    }
    if( (x & 0x0f)!=JSONB_OBJECT ) return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    j = iRoot + n;  /* j is the index of a label */
    iEnd = j+sz;
    while( j<iEnd ){
      int rawLabel;
      const char *zLabel;
      x = pParse->aBlob[j] & 0x0f;
      if( x<JSONB_TEXT || x>JSONB_TEXTRAW ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      k = j+n;  /* k is the index of the label text */
      if( k+sz>=iEnd ) return JSON_LOOKUP_ERROR;
      zLabel = (const char*)&pParse->aBlob[k];
      rawLabel = x==JSONB_TEXT || x==JSONB_TEXTRAW;
      if( jsonLabelCompare(zKey, nKey, rawKey, zLabel, sz, rawLabel) ){
        u32 v = k+sz;  /* v is the index of the value */
        if( ((pParse->aBlob[v])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
        n = jsonbPayloadSize(pParse, v, &sz);
        if( n==0 || v+n+sz>iEnd ) return JSON_LOOKUP_ERROR;
        assert( j>0 );
        rc = jsonLookupStep(pParse, v, &zPath[i], j);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      j = k+sz;
      if( ((pParse->aBlob[j])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( pParse->eEdit>=JEDIT_INS ){
      u32 nIns;          /* Total bytes to insert (label+value) */
      JsonParse v;       /* BLOB encoding of the value to be inserted */
      JsonParse ix;      /* Header of the label to be inserted */
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      memset(&ix, 0, sizeof(ix));
      ix.db = pParse->db;
      jsonBlobAppendNode(&ix, rawKey?JSONB_TEXTRAW:JSONB_TEXT5, nKey, 0);
      pParse->oom |= ix.oom;
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, ix.nBlob+nKey+v.nBlob)
      ){
        assert( !pParse->oom );
        nIns = ix.nBlob + nKey + v.nBlob;
        jsonBlobEdit(pParse, j, 0, 0, nIns);
        if( !pParse->oom ){
          assert( pParse->aBlob!=0 ); /* Because pParse->oom!=0 */
          assert( ix.aBlob!=0 );      /* Because pPasre->oom!=0 */
          memcpy(&pParse->aBlob[j], ix.aBlob, ix.nBlob);
          k = j + ix.nBlob;
          memcpy(&pParse->aBlob[k], zKey, nKey);
          k += nKey;
          memcpy(&pParse->aBlob[k], v.aBlob, v.nBlob);
          if( ALWAYS(pParse->delta) ) jsonAfterEditSizeAdjust(pParse, iRoot);
        }
      }
      jsonParseReset(&v);
      jsonParseReset(&ix);
      return rc;
    }
  }else if( zPath[0]=='[' ){
    x = pParse->aBlob[iRoot] & 0x0f;
    if( x!=JSONB_ARRAY )  return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    k = 0;
    i = 1;
    while( sqlite3Isdigit(zPath[i]) ){
      k = k*10 + zPath[i] - '0';
      i++;
    }
    if( i<2 || zPath[i]!=']' ){
      if( zPath[1]=='#' ){
        k = jsonbArrayCount(pParse, iRoot);
        i = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int nn = 0;
          i = 3;
          do{
            nn = nn*10 + zPath[i] - '0';
            i++;
          }while( sqlite3Isdigit(zPath[i]) );
          if( nn>k ) return JSON_LOOKUP_NOTFOUND;
          k -= nn;
        }
        if( zPath[i]!=']' ){
          return JSON_LOOKUP_PATHERROR;
        }
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
    }
    j = iRoot+n;
    iEnd = j+sz;
    while( j<iEnd ){
      if( k==0 ){
        rc = jsonLookupStep(pParse, j, &zPath[i+1], 0);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      k--;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( k>0 ) return JSON_LOOKUP_NOTFOUND;
    if( pParse->eEdit>=JEDIT_INS ){
      JsonParse v;
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i+1]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, v.nBlob)
      ){
        assert( !pParse->oom );
        jsonBlobEdit(pParse, j, 0, v.aBlob, v.nBlob);
      }
      jsonParseReset(&v);
      if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
      return rc;
    }
  }else{
    return JSON_LOOKUP_PATHERROR;
  }
  return JSON_LOOKUP_NOTFOUND;
}